

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

int __thiscall raspicam::_private::Private_Impl_Still::createCamera(Private_Impl_Still *this)

{
  MMAL_COMPONENT_T *pMVar1;
  MMAL_ES_FORMAT_T *pMVar2;
  MMAL_PORT_T *port;
  MMAL_STATUS_T MVar3;
  ostream *poVar4;
  char *pcVar5;
  MMAL_PARAMETER_HEADER_T local_40;
  uint local_38;
  uint local_34;
  undefined8 local_30;
  uint local_28;
  uint local_24;
  undefined8 local_20;
  undefined8 uStack_18;
  
  MVar3 = mmal_component_create("vc.ril.camera",&this->camera);
  if (MVar3 == MMAL_SUCCESS) {
    pMVar1 = this->camera;
    if (pMVar1->output_num == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      pcVar5 = ": Camera does not have output ports!\n";
    }
    else {
      this->camera_still_port = pMVar1->output[2];
      MVar3 = mmal_port_enable(pMVar1->control,control_callback);
      if (MVar3 == MMAL_SUCCESS) {
        local_40.id = 0x10015;
        local_40.size = 0x30;
        local_38 = this->width;
        local_34 = this->height;
        local_30 = 0x100000000;
        local_20 = 3;
        uStack_18 = 0x200000000;
        local_28 = local_38;
        local_24 = local_34;
        MVar3 = mmal_port_parameter_set(this->camera->control,&local_40);
        if (MVar3 != MMAL_SUCCESS) {
          poVar4 = std::operator<<((ostream *)&std::cout,this->API_NAME);
          std::operator<<(poVar4,": Could not set port parameters.\n");
        }
        commitParameters(this);
        pMVar2 = this->camera_still_port->format;
        pMVar2->encoding = 0x5651504f;
        (pMVar2->es->audio).channels = this->width;
        (pMVar2->es->audio).sample_rate = this->height;
        (pMVar2->es->audio).bits_per_sample = 0;
        (pMVar2->es->audio).block_align = 0;
        (pMVar2->es->video).crop.width = this->width;
        (pMVar2->es->video).crop.height = this->height;
        (pMVar2->es->video).frame_rate.num = 3;
        (pMVar2->es->video).frame_rate.den = 1;
        port = this->camera_still_port;
        if (port->buffer_size < port->buffer_size_min) {
          port->buffer_size = port->buffer_size_min;
        }
        port->buffer_num = port->buffer_num_recommended;
        MVar3 = mmal_port_format_commit(port);
        if (MVar3 == MMAL_SUCCESS) {
          MVar3 = mmal_component_enable(this->camera);
          if (MVar3 == MMAL_SUCCESS) {
            return 0;
          }
          pcVar5 = ": Camera component could not be enabled.\n";
        }
        else {
          pcVar5 = ": Camera still format could not be set.\n";
        }
        poVar4 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,this->API_NAME);
        pcVar5 = ": Could not enable control port.\n";
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    pcVar5 = ": Failed to create camera component.\n";
  }
  std::operator<<(poVar4,pcVar5);
  destroyCamera(this);
  return -1;
}

Assistant:

int Private_Impl_Still::createCamera() {
            if ( mmal_component_create ( MMAL_COMPONENT_DEFAULT_CAMERA, &camera ) ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            }

            if ( !camera->output_num ) {
                cout << API_NAME << ": Camera does not have output ports!\n";
                destroyCamera();
                return -1;
            }

            camera_still_port = camera->output[MMAL_CAMERA_CAPTURE_PORT];

            // Enable the camera, and tell it its control callback function
            if ( mmal_port_enable ( camera->control, control_callback ) ) {
                cout << API_NAME << ": Could not enable control port.\n";
                destroyCamera();
                return -1;
            }

            MMAL_PARAMETER_CAMERA_CONFIG_T camConfig = {
                {MMAL_PARAMETER_CAMERA_CONFIG, sizeof ( camConfig ) },
                width, // max_stills_w
                height, // max_stills_h
                0, // stills_yuv422
                1, // one_shot_stills
                width, // max_preview_video_w
                height, // max_preview_video_h
                3, // num_preview_video_frames
                0, // stills_capture_circular_buffer_height
                0, // fast_preview_resume
                MMAL_PARAM_TIMESTAMP_MODE_RESET_STC // use_stc_timestamp
            };
            if ( mmal_port_parameter_set ( camera->control, &camConfig.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Could not set port parameters.\n";

            commitParameters();

            MMAL_ES_FORMAT_T * format = camera_still_port->format;
            format->encoding = MMAL_ENCODING_OPAQUE;
            format->es->video.width = width;
            format->es->video.height = height;
            format->es->video.crop.x = 0;
            format->es->video.crop.y = 0;
            format->es->video.crop.width = width;
            format->es->video.crop.height = height;
            format->es->video.frame_rate.num = STILLS_FRAME_RATE_NUM;
            format->es->video.frame_rate.den = STILLS_FRAME_RATE_DEN;

            if ( camera_still_port->buffer_size < camera_still_port->buffer_size_min )
                camera_still_port->buffer_size = camera_still_port->buffer_size_min;

            camera_still_port->buffer_num = camera_still_port->buffer_num_recommended;

            if ( mmal_port_format_commit ( camera_still_port ) ) {
                cout << API_NAME << ": Camera still format could not be set.\n";
                destroyCamera();
                return -1;
            }

            if ( mmal_component_enable ( camera ) ) {
                cout << API_NAME << ": Camera component could not be enabled.\n";
                destroyCamera();
                return -1;
            }

            // This is the reason I could not free fully the camera because this pool could never be freed since 
            // the pointer encoder_pool was reassigned in createEncoder function, we lost its reference
            // so this allocation is useless or misused -> camera_pool ?
            /*if ( ! ( encoder_pool = mmal_port_pool_create ( camera_still_port, camera_still_port->buffer_num, camera_still_port->buffer_size ) ) ) {
                    cout << API_NAME << ": Failed to create buffer header pool for camera.\n";
                    destroyCamera();
                    return -1;
            }*/

            return 0;
        }